

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cpp
# Opt level: O1

void parallel_transform<std::vector<int,std::allocator<int>>,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
               (size_t W)

{
  _List_node_base *p_Var1;
  code *pcVar2;
  double dVar3;
  uint __val;
  pointer puVar4;
  pointer puVar5;
  uint uVar6;
  char extraout_AL;
  bool bVar7;
  int iVar8;
  uint uVar9;
  _Self __tmp;
  time_t tVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  pointer *__ptr;
  default_delete<tf::Node> *pdVar14;
  int *piVar15;
  Executor *this;
  uint uVar16;
  uint __len;
  _List_node_base *p_Var17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar19;
  in_place_type_t<tf::Node::Runtime> local_382;
  DefaultTaskParams local_381;
  ulong local_380;
  string __str;
  vector<int,_std::allocator<int>_> src;
  _List_node_base *local_340;
  undefined4 local_338;
  Task to;
  iterator tgt_beg;
  const_iterator src_end;
  ResultBuilder DOCTEST_RB;
  Result local_2a0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tgt;
  Task from;
  const_iterator src_beg;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  tVar10 = time((time_t *)0x0);
  srand((uint)tVar10);
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_380 = 0;
  lVar13 = 0;
  do {
    puVar5 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar8 = *(int *)((long)&DAT_00144118 + lVar13);
    pdVar14 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar14 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar14,*(Node **)pdVar14);
        }
        *(undefined8 *)pdVar14 = 0;
        pdVar14 = pdVar14 + 8;
      } while (pdVar14 != (default_delete<tf::Node> *)puVar5);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    puVar5 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    src_beg._M_current = (int *)0x0;
    src_end._M_current = (int *)0x0;
    tgt_beg._M_node = (_List_node_base *)0x0;
    src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    tgt.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&tgt;
    tgt.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    pdVar14 = (default_delete<tf::Node> *)
              taskflow._graph.
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              .
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    tgt.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         tgt.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)pdVar14 != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(pdVar14,*(Node **)pdVar14);
        }
        *(undefined8 *)pdVar14 = 0;
        pdVar14 = pdVar14 + 8;
      } while (pdVar14 != (default_delete<tf::Node> *)puVar5);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&src;
    DOCTEST_RB.super_AssertData._8_8_ = &local_380;
    DOCTEST_RB.super_AssertData.m_file = (char *)&tgt;
    DOCTEST_RB.super_AssertData.m_expr = (char *)&src_end;
    DOCTEST_RB.super_AssertData._40_8_ = &tgt_beg;
    local_2a0.m_passed = false;
    local_2a0._1_7_ = 0;
    __str._M_dataplus._M_p = (pointer)0x0;
    local_340 = (_List_node_base *)((ulong)local_340 & 0xffffffff00000000);
    DOCTEST_RB.super_AssertData._24_8_ = (TestCaseData *)&src_beg;
    from._node = tf::Graph::
                 _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,parallel_transform<std::vector<int,std::allocator<int>>,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_long)::_lambda()_1_>
                           (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                            (DefaultTaskParams *)&to,(void **)&local_2a0,(void **)&__str,
                            (int *)&local_340,(in_place_type_t<tf::Node::Static> *)&local_381,
                            (anon_class_48_6_c0e1b691 *)&DOCTEST_RB);
    DOCTEST_RB.super_AssertData._8_8_ = &src_end;
    DOCTEST_RB.super_AssertData.m_file = (char *)&tgt_beg;
    local_2a0.m_passed = false;
    local_2a0._1_7_ = 0;
    __str._M_dataplus._M_p = (pointer)0x0;
    local_340 = (_List_node_base *)((ulong)local_340 & 0xffffffff00000000);
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&src_beg;
    DOCTEST_RB.super_AssertData._24_8_ = (long)iVar8;
    to._node = tf::Graph::
               _emplace_back<const_int_&,_const_int_&,_tf::DefaultTaskParams,_std::nullptr_t,_std::nullptr_t,_int,_std::in_place_type_t<tf::Node::Runtime>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_transform_hpp:20:10)>
                         (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                          &local_381,(void **)&local_2a0,(void **)&__str,(int *)&local_340,
                          &local_382,(anon_class_48_5_34260e0f *)&DOCTEST_RB);
    tf::Task::precede<tf::Task&>(&from,&to);
    local_2a0.m_passed = true;
    local_2a0._1_7_ = 0;
    this = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,this,&taskflow,(anon_class_8_1_69701ed9 *)&local_2a0,
               (anon_class_1_0_00000001 *)&__str);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) {
      uVar11 = std::__throw_future_error(3);
      __cxa_end_catch();
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&tgt.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      if (src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          != (pointer)0x0) {
        operator_delete(src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tf::Executor::~Executor(&executor);
      tf::Taskflow::~Taskflow(&taskflow);
      _Unwind_Resume(uVar11);
    }
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar15 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar8 = *piVar15;
        *piVar15 = *piVar15 + -1;
        UNLOCK();
      }
      else {
        iVar8 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    piVar15 = src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    p_Var17 = tgt.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      do {
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_transform.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x3b;
        DOCTEST_RB.super_AssertData.m_expr = "*d_itr++ == std::to_string(*s_itr++ + 10)";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        p_Var1 = p_Var17->_M_next;
        local_340 = p_Var17 + 1;
        local_338 = 0xc;
        uVar16 = *piVar15 + 10;
        __val = -uVar16;
        if (0 < (int)uVar16) {
          __val = uVar16;
        }
        __len = 1;
        if (9 < __val) {
          uVar12 = (ulong)__val;
          uVar6 = 4;
          do {
            __len = uVar6;
            uVar9 = (uint)uVar12;
            if (uVar9 < 100) {
              __len = __len - 2;
              goto LAB_0011b1d6;
            }
            if (uVar9 < 1000) {
              __len = __len - 1;
              goto LAB_0011b1d6;
            }
            if (uVar9 < 10000) goto LAB_0011b1d6;
            uVar12 = uVar12 / 10000;
            uVar6 = __len + 4;
          } while (99999 < uVar9);
          __len = __len + 1;
        }
LAB_0011b1d6:
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + (uVar16 >> 0x1f),__len,__val);
        doctest::detail::Expression_lhs<std::__cxx11::string_const&>::operator==
                  (&local_2a0,(Expression_lhs<std::__cxx11::string_const&> *)&local_340,&__str);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_2a0.m_decomp);
        DOCTEST_RB.super_AssertData._40_8_ =
             CONCAT71(DOCTEST_RB.super_AssertData._41_7_,local_2a0.m_passed) ^ 1;
        uVar18 = extraout_XMM0_Da;
        uVar19 = extraout_XMM0_Db;
        if ((local_2a0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_2a0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_2a0.m_decomp.field_0.data.ptr);
          uVar18 = extraout_XMM0_Da_00;
          uVar19 = extraout_XMM0_Db_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          uVar18 = extraout_XMM0_Da_01;
          uVar19 = extraout_XMM0_Db_01;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar19,uVar18));
        if (extraout_AL != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar7) {
            doctest::detail::throwException();
          }
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        piVar15 = piVar15 + 1;
        p_Var17 = p_Var1;
      } while (piVar15 !=
               src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&tgt.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    if (src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar13 = lVar13 + 4;
    if (lVar13 == 0x14) {
      local_380 = local_380 * 2 + 2;
      lVar13 = 0;
      if (999 < local_380) {
        tf::Executor::~Executor(&executor);
        tf::Taskflow::~Taskflow(&taskflow);
        return;
      }
    }
  } while( true );
}

Assistant:

void parallel_transform(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  for(size_t N=0; N<1000; N=(N+1)*2) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      taskflow.clear();

      typename T::const_iterator src_beg;
      typename T::const_iterator src_end;
      std::list<std::string>::iterator tgt_beg;

      T src;
      std::list<std::string> tgt;

      taskflow.clear();

      auto from = taskflow.emplace([&](){
        src.resize(N);
        for(auto& d : src) {
          d = ::rand() % 10;
          tgt.emplace_back("hi");
        }
        src_beg = src.begin();
        src_end = src.end();
        tgt_beg = tgt.begin();
      });

      auto to = taskflow.transform(
        std::ref(src_beg), std::ref(src_end), std::ref(tgt_beg),
        [] (const auto& in) {
          return std::to_string(in+10);
        },
        P(c)
      );

      from.precede(to);

      executor.run(taskflow).wait();

      auto s_itr = src.begin();
      auto d_itr = tgt.begin();
      while(s_itr != src.end()) {
        REQUIRE(*d_itr++ == std::to_string(*s_itr++ + 10));
      }
    }
  }
}